

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v8::vprint(FILE *f,string_view format_str,format_args args)

{
  size_t sVar1;
  string_view text;
  memory_buffer buffer;
  buffer<char> local_228;
  FILE local_208 [504];
  
  local_228.size_ = 0;
  local_228._vptr_buffer = (_func_int **)&PTR_grow_001594c0;
  local_228.capacity_ = 500;
  sVar1 = args.desc_;
  local_228.ptr_ = (char *)local_208;
  detail::vformat_to<char>(&local_228,format_str,args,(locale_ref)0x0);
  text.size_ = sVar1;
  text.data_ = (char *)local_228.size_;
  detail::print((detail *)f,(FILE *)local_228.ptr_,text);
  if ((FILE *)local_228.ptr_ != local_208) {
    operator_delete(local_228.ptr_);
  }
  return;
}

Assistant:

FMT_FUNC void vprint(std::FILE* f, string_view format_str, format_args args) {
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  detail::print(f, {buffer.data(), buffer.size()});
}